

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLUri::initialize(XMLUri *this,XMLUri *toCopy)

{
  short *psVar1;
  MemoryManager *pMVar2;
  XMLCh *pXVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  size_t sVar6;
  XMLCh *pXVar5;
  
  pMVar2 = toCopy->fMemoryManager;
  this->fMemoryManager = pMVar2;
  pXVar3 = toCopy->fScheme;
  if (pXVar3 == (XMLCh *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar3 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,sVar6);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var,iVar4);
    memcpy(pXVar5,pXVar3,sVar6);
  }
  this->fScheme = pXVar5;
  pXVar3 = toCopy->fUserInfo;
  if (pXVar3 == (XMLCh *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar3 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
    memcpy(pXVar5,pXVar3,sVar6);
  }
  this->fUserInfo = pXVar5;
  pXVar3 = toCopy->fHost;
  if (pXVar3 == (XMLCh *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar3 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var_01,iVar4);
    memcpy(pXVar5,pXVar3,sVar6);
  }
  this->fHost = pXVar5;
  this->fPort = toCopy->fPort;
  pXVar3 = toCopy->fRegAuth;
  if (pXVar3 == (XMLCh *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar3 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var_02,iVar4);
    memcpy(pXVar5,pXVar3,sVar6);
  }
  this->fRegAuth = pXVar5;
  pXVar3 = toCopy->fPath;
  if (pXVar3 == (XMLCh *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar3 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var_03,iVar4);
    memcpy(pXVar5,pXVar3,sVar6);
  }
  this->fPath = pXVar5;
  pXVar3 = toCopy->fQueryString;
  if (pXVar3 == (XMLCh *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar3 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var_04,iVar4);
    memcpy(pXVar5,pXVar3,sVar6);
  }
  this->fQueryString = pXVar5;
  pXVar3 = toCopy->fFragment;
  if (pXVar3 == (XMLCh *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar3 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var_05,iVar4);
    memcpy(pXVar5,pXVar3,sVar6);
  }
  this->fFragment = pXVar5;
  return;
}

Assistant:

void XMLUri::initialize(const XMLUri& toCopy)
{
    //
    // assuming that all fields from the toCopy are valid,
    // therefore need NOT to go through various setXXX() methods
    //
    fMemoryManager = toCopy.fMemoryManager;
    fScheme = XMLString::replicate(toCopy.fScheme, fMemoryManager);
    fUserInfo = XMLString::replicate(toCopy.fUserInfo, fMemoryManager);
    fHost = XMLString::replicate(toCopy.fHost, fMemoryManager);
    fPort = toCopy.fPort;
    fRegAuth = XMLString::replicate(toCopy.fRegAuth, fMemoryManager);
    fPath = XMLString::replicate(toCopy.fPath, fMemoryManager);
    fQueryString = XMLString::replicate(toCopy.fQueryString, fMemoryManager);
    fFragment = XMLString::replicate(toCopy.fFragment, fMemoryManager);
}